

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

void av1_convolve_x_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  undefined2 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  int iVar14;
  int in_ECX;
  int iVar15;
  undefined4 *in_RDX;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  long in_stack_00000008;
  long in_stack_00000018;
  __m128i res_1;
  __m128i res16_1;
  __m128i res_hi_round;
  __m128i res_lo_round_1;
  __m128i res_hi;
  __m128i res_lo_1;
  __m128i res_odd;
  __m128i res_even;
  __m128i s_1 [4];
  __m128i data_1;
  int j;
  int i;
  int r;
  __m128i res;
  __m128i res16;
  __m128i res_lo_round;
  __m128i res_lo;
  __m128i s [4];
  __m128i data;
  __m128i coeffs [4];
  __m128i round_shift;
  __m128i round_0_shift;
  __m128i round_const;
  __m128i round_0_const;
  int bits;
  uint8_t *src_ptr;
  int fo_horiz;
  int in_stack_fffffffffffffa24;
  undefined8 in_stack_fffffffffffffa28;
  uint8_t *in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa3c;
  undefined1 in_stack_fffffffffffffa3d;
  undefined1 in_stack_fffffffffffffa3e;
  undefined1 in_stack_fffffffffffffa3f;
  char in_stack_fffffffffffffa40;
  char in_stack_fffffffffffffa41;
  char in_stack_fffffffffffffa42;
  char in_stack_fffffffffffffa43;
  char in_stack_fffffffffffffa44;
  char in_stack_fffffffffffffa45;
  char in_stack_fffffffffffffa46;
  char in_stack_fffffffffffffa47;
  __m128i *s_00;
  undefined1 in_stack_fffffffffffffa48 [16];
  int in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  int local_4f4;
  int local_4f0;
  int in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  undefined1 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb81;
  undefined1 in_stack_fffffffffffffb82;
  undefined1 in_stack_fffffffffffffb83;
  undefined1 in_stack_fffffffffffffb84;
  undefined1 in_stack_fffffffffffffb85;
  undefined1 in_stack_fffffffffffffb86;
  undefined1 in_stack_fffffffffffffb87;
  int in_stack_fffffffffffffb8c;
  undefined1 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb91;
  undefined1 in_stack_fffffffffffffb92;
  undefined1 in_stack_fffffffffffffb93;
  undefined1 in_stack_fffffffffffffb94;
  undefined1 in_stack_fffffffffffffb95;
  undefined1 in_stack_fffffffffffffb96;
  undefined1 in_stack_fffffffffffffb97;
  byte local_3d4;
  int local_3c4;
  undefined4 *local_3b8;
  ulong local_398;
  ulong local_378;
  InterpFilterParams *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  int local_88;
  int iStack_84;
  int local_78;
  int iStack_74;
  int iStack_60;
  int iStack_5c;
  int iStack_50;
  int iStack_4c;
  
  if (*(ushort *)(in_stack_00000008 + 8) < 9) {
    uVar13 = 7 - *(int *)(in_stack_00000018 + 0x14);
    iVar15 = (1 << (*(byte *)(in_stack_00000018 + 0x14) & 0x1f)) >> 1;
    local_3d4 = (byte)uVar13;
    iVar14 = (1 << (local_3d4 & 0x1f)) >> 1;
    local_378 = CONCAT44(0,*(uint *)(in_stack_00000018 + 0x14));
    local_398 = CONCAT44(0,uVar13);
    prepare_coeffs(in_stack_fffffffffffffa48._8_8_,in_stack_fffffffffffffa48._4_4_,
                   (__m128i *)
                   CONCAT17(in_stack_fffffffffffffa47,
                            CONCAT16(in_stack_fffffffffffffa46,
                                     CONCAT15(in_stack_fffffffffffffa45,
                                              CONCAT14(in_stack_fffffffffffffa44,
                                                       CONCAT13(in_stack_fffffffffffffa43,
                                                                CONCAT12(in_stack_fffffffffffffa42,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa41,
                                                  in_stack_fffffffffffffa40))))))));
    local_3c4 = in_R9D;
    local_3b8 = in_RDX;
    if (in_R8D < 5) {
      do {
        convolve_lo_x(in_stack_fffffffffffffa48._0_8_,
                      (__m128i *)
                      CONCAT17(in_stack_fffffffffffffa47,
                               CONCAT16(in_stack_fffffffffffffa46,
                                        CONCAT15(in_stack_fffffffffffffa45,
                                                 CONCAT14(in_stack_fffffffffffffa44,
                                                          CONCAT13(in_stack_fffffffffffffa43,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffa42,
                                                  CONCAT11(in_stack_fffffffffffffa41,
                                                           in_stack_fffffffffffffa40))))))));
        local_168 = (int)extraout_XMM0_Qa;
        iStack_164 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_160 = (int)extraout_XMM0_Qb;
        iStack_15c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_378;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_398;
        uVar2 = CONCAT44((iStack_164 + iVar15 >> auVar8) + iVar14 >> auVar7,
                         (local_168 + iVar15 >> auVar8) + iVar14 >> auVar7);
        uVar3 = CONCAT44((iStack_15c + iVar15 >> auVar8) + iVar14 >> auVar7,
                         (iStack_160 + iVar15 >> auVar8) + iVar14 >> auVar7);
        auVar12._8_8_ = uVar3;
        auVar12._0_8_ = uVar2;
        auVar11._8_8_ = uVar3;
        auVar11._0_8_ = uVar2;
        auVar16 = packssdw(auVar12,auVar11);
        local_c8 = auVar16._0_2_;
        sStack_c6 = auVar16._2_2_;
        sStack_c4 = auVar16._4_2_;
        sStack_c2 = auVar16._6_2_;
        uVar1 = CONCAT11((0 < sStack_c6) * (sStack_c6 < 0x100) * auVar16[2] - (0xff < sStack_c6),
                         (0 < local_c8) * (local_c8 < 0x100) * auVar16[0] - (0xff < local_c8));
        if (in_R8D == 2) {
          *(undefined2 *)local_3b8 = uVar1;
        }
        else {
          *local_3b8 = CONCAT13((0 < sStack_c2) * (sStack_c2 < 0x100) * auVar16[6] -
                                (0xff < sStack_c2),
                                CONCAT12((0 < sStack_c4) * (sStack_c4 < 0x100) * auVar16[4] -
                                         (0xff < sStack_c4),uVar1));
        }
        local_3b8 = (undefined4 *)((long)local_3b8 + (long)in_ECX);
        local_3c4 = local_3c4 + -1;
      } while (local_3c4 != 0);
    }
    else {
      local_4f0 = 0;
      do {
        local_4f4 = 0;
        do {
          s_00 = in_stack_fffffffffffffa48._0_8_;
          convolve_lo_x(s_00,(__m128i *)
                             CONCAT17(in_stack_fffffffffffffa47,
                                      CONCAT16(in_stack_fffffffffffffa46,
                                               CONCAT15(in_stack_fffffffffffffa45,
                                                        CONCAT14(in_stack_fffffffffffffa44,
                                                                 CONCAT13(in_stack_fffffffffffffa43,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffa42,
                                                  CONCAT11(in_stack_fffffffffffffa41,
                                                           in_stack_fffffffffffffa40))))))));
          convolve_lo_x(s_00,(__m128i *)
                             CONCAT17(in_stack_fffffffffffffa47,
                                      CONCAT16(in_stack_fffffffffffffa46,
                                               CONCAT15(in_stack_fffffffffffffa45,
                                                        CONCAT14(in_stack_fffffffffffffa44,
                                                                 CONCAT13(in_stack_fffffffffffffa43,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffa42,
                                                  CONCAT11(in_stack_fffffffffffffa41,
                                                           in_stack_fffffffffffffa40))))))));
          local_78 = (int)extraout_XMM0_Qa_00;
          iStack_74 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
          local_88 = (int)extraout_XMM0_Qa_01;
          iStack_84 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
          iStack_50 = (int)extraout_XMM0_Qb_00;
          iStack_4c = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
          iStack_60 = (int)extraout_XMM0_Qb_01;
          iStack_5c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_378;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_398;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_378;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_398;
          auVar10._4_4_ = (local_88 + iVar15 >> auVar6) + iVar14 >> auVar5;
          auVar10._0_4_ = (local_78 + iVar15 >> auVar6) + iVar14 >> auVar5;
          auVar10._12_4_ = (iStack_84 + iVar15 >> auVar6) + iVar14 >> auVar5;
          auVar10._8_4_ = (iStack_74 + iVar15 >> auVar6) + iVar14 >> auVar5;
          auVar9._4_4_ = (iStack_60 + iVar15 >> auVar4) + iVar14 >> auVar16;
          auVar9._0_4_ = (iStack_50 + iVar15 >> auVar4) + iVar14 >> auVar16;
          auVar9._12_4_ = (iStack_5c + iVar15 >> auVar4) + iVar14 >> auVar16;
          auVar9._8_4_ = (iStack_4c + iVar15 >> auVar4) + iVar14 >> auVar16;
          in_stack_fffffffffffffa48 = packssdw(auVar10,auVar9);
          local_e8 = in_stack_fffffffffffffa48._0_2_;
          sStack_e6 = in_stack_fffffffffffffa48._2_2_;
          sStack_e4 = in_stack_fffffffffffffa48._4_2_;
          sStack_e2 = in_stack_fffffffffffffa48._6_2_;
          sStack_e0 = in_stack_fffffffffffffa48._8_2_;
          sStack_de = in_stack_fffffffffffffa48._10_2_;
          sStack_dc = in_stack_fffffffffffffa48._12_2_;
          sStack_da = in_stack_fffffffffffffa48._14_2_;
          in_stack_fffffffffffffa40 =
               (0 < local_e8) * (local_e8 < 0x100) * in_stack_fffffffffffffa48[0] -
               (0xff < local_e8);
          in_stack_fffffffffffffa41 =
               (0 < sStack_e6) * (sStack_e6 < 0x100) * in_stack_fffffffffffffa48[2] -
               (0xff < sStack_e6);
          in_stack_fffffffffffffa42 =
               (0 < sStack_e4) * (sStack_e4 < 0x100) * in_stack_fffffffffffffa48[4] -
               (0xff < sStack_e4);
          in_stack_fffffffffffffa43 =
               (0 < sStack_e2) * (sStack_e2 < 0x100) * in_stack_fffffffffffffa48[6] -
               (0xff < sStack_e2);
          in_stack_fffffffffffffa44 =
               (0 < sStack_e0) * (sStack_e0 < 0x100) * in_stack_fffffffffffffa48[8] -
               (0xff < sStack_e0);
          in_stack_fffffffffffffa45 =
               (0 < sStack_de) * (sStack_de < 0x100) * in_stack_fffffffffffffa48[10] -
               (0xff < sStack_de);
          in_stack_fffffffffffffa46 =
               (0 < sStack_dc) * (sStack_dc < 0x100) * in_stack_fffffffffffffa48[0xc] -
               (0xff < sStack_dc);
          in_stack_fffffffffffffa47 =
               (0 < sStack_da) * (sStack_da < 0x100) * in_stack_fffffffffffffa48[0xe] -
               (0xff < sStack_da);
          *(ulong *)((long)in_RDX + (long)local_4f4 + (long)(local_4f0 * in_ECX)) =
               CONCAT17((0 < sStack_da) * (sStack_da < 0x100) * in_stack_fffffffffffffa48[0xe] -
                        (0xff < sStack_da),
                        CONCAT16((0 < sStack_dc) * (sStack_dc < 0x100) *
                                 in_stack_fffffffffffffa48[0xc] - (0xff < sStack_dc),
                                 CONCAT15((0 < sStack_de) * (sStack_de < 0x100) *
                                          in_stack_fffffffffffffa48[10] - (0xff < sStack_de),
                                          CONCAT14((0 < sStack_e0) * (sStack_e0 < 0x100) *
                                                   in_stack_fffffffffffffa48[8] - (0xff < sStack_e0)
                                                   ,CONCAT13((0 < sStack_e2) * (sStack_e2 < 0x100) *
                                                             in_stack_fffffffffffffa48[6] -
                                                             (0xff < sStack_e2),
                                                             CONCAT12((0 < sStack_e4) *
                                                                      (sStack_e4 < 0x100) *
                                                                      in_stack_fffffffffffffa48[4] -
                                                                      (0xff < sStack_e4),
                                                                      CONCAT11((0 < sStack_e6) *
                                                                               (sStack_e6 < 0x100) *
                                                                                                                                                              
                                                  in_stack_fffffffffffffa48[2] - (0xff < sStack_e6),
                                                  (0 < local_e8) * (local_e8 < 0x100) *
                                                  in_stack_fffffffffffffa48[0] - (0xff < local_e8)))
                                                  )))));
          local_4f4 = local_4f4 + 8;
        } while (local_4f4 < in_R8D);
        local_4f0 = local_4f0 + 1;
      } while (local_4f0 < in_R9D);
    }
  }
  else if (in_R8D < 4) {
    av1_convolve_x_sr_c((uint8_t *)
                        CONCAT17(in_stack_fffffffffffffa47,
                                 CONCAT16(in_stack_fffffffffffffa46,
                                          CONCAT15(in_stack_fffffffffffffa45,
                                                   CONCAT14(in_stack_fffffffffffffa44,
                                                            CONCAT13(in_stack_fffffffffffffa43,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffffa42,
                                                  CONCAT11(in_stack_fffffffffffffa41,
                                                           in_stack_fffffffffffffa40))))))),
                        CONCAT13(in_stack_fffffffffffffa3f,
                                 CONCAT12(in_stack_fffffffffffffa3e,
                                          CONCAT11(in_stack_fffffffffffffa3d,
                                                   in_stack_fffffffffffffa3c))),
                        in_stack_fffffffffffffa30,(int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                        (int)in_stack_fffffffffffffa28,in_stack_fffffffffffffa24,
                        in_stack_fffffffffffffa48._8_8_,in_stack_fffffffffffffa58,
                        (ConvolveParams *)
                        CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
  }
  else {
    convolve_x_sr_12tap_sse2
              ((uint8_t *)
               CONCAT17(in_stack_fffffffffffffb97,
                        CONCAT16(in_stack_fffffffffffffb96,
                                 CONCAT15(in_stack_fffffffffffffb95,
                                          CONCAT14(in_stack_fffffffffffffb94,
                                                   CONCAT13(in_stack_fffffffffffffb93,
                                                            CONCAT12(in_stack_fffffffffffffb92,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb91,
                                                  in_stack_fffffffffffffb90))))))),
               in_stack_fffffffffffffb8c,
               (uint8_t *)
               CONCAT17(in_stack_fffffffffffffb87,
                        CONCAT16(in_stack_fffffffffffffb86,
                                 CONCAT15(in_stack_fffffffffffffb85,
                                          CONCAT14(in_stack_fffffffffffffb84,
                                                   CONCAT13(in_stack_fffffffffffffb83,
                                                            CONCAT12(in_stack_fffffffffffffb82,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb81,
                                                  in_stack_fffffffffffffb80))))))),
               in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,in_stack_fffffffffffffb74,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8,
               (ConvolveParams *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  }
  return;
}

Assistant:

void av1_convolve_x_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_x,
                            const int subpel_x_qn,
                            ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 4) {
      av1_convolve_x_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_x, subpel_x_qn, conv_params);
    } else {
      convolve_x_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_x, subpel_x_qn, conv_params);
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_horiz;
    const int bits = FILTER_BITS - conv_params->round_0;
    const __m128i round_0_const =
        _mm_set1_epi32((1 << conv_params->round_0) >> 1);
    const __m128i round_const = _mm_set1_epi32((1 << bits) >> 1);
    const __m128i round_0_shift = _mm_cvtsi32_si128(conv_params->round_0);
    const __m128i round_shift = _mm_cvtsi32_si128(bits);
    __m128i coeffs[4];

    assert(bits >= 0);
    assert((FILTER_BITS - conv_params->round_1) >= 0 ||
           ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

    if (w <= 4) {
      do {
        const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
        __m128i s[4];

        s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
        s[1] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
        s[2] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
        s[3] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
        const __m128i res_lo = convolve_lo_x(s, coeffs);
        __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_0_const), round_0_shift);
        res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                     round_shift);

        const __m128i res16 = _mm_packs_epi32(res_lo_round, res_lo_round);
        const __m128i res = _mm_packus_epi16(res16, res16);

        int r = _mm_cvtsi128_si32(res);
        if (w == 2)
          *(uint16_t *)dst = (uint16_t)r;
        else
          *(int *)dst = r;

        src_ptr += src_stride;
        dst += dst_stride;
      } while (--h);
    } else {
      assert(!(w % 8));
      int i = 0;
      do {
        int j = 0;
        do {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          __m128i s[4];

          // Filter even-index pixels
          s[0] = data;
          s[1] = _mm_srli_si128(data, 2);
          s[2] = _mm_srli_si128(data, 4);
          s[3] = _mm_srli_si128(data, 6);
          const __m128i res_even = convolve_lo_x(s, coeffs);

          // Filter odd-index pixels
          s[0] = _mm_srli_si128(data, 1);
          s[1] = _mm_srli_si128(data, 3);
          s[2] = _mm_srli_si128(data, 5);
          s[3] = _mm_srli_si128(data, 7);
          const __m128i res_odd = convolve_lo_x(s, coeffs);

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
          __m128i res_lo_round = _mm_sra_epi32(
              _mm_add_epi32(res_lo, round_0_const), round_0_shift);
          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          __m128i res_hi_round = _mm_sra_epi32(
              _mm_add_epi32(res_hi, round_0_const), round_0_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          j += 8;
        } while (j < w);
      } while (++i < h);
    }
  }
}